

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O3

void __thiscall VcprojGenerator::initWinDeployQtTool(VcprojGenerator *this)

{
  QMakeProject *pQVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  bool bVar6;
  ProStringList *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QStringView config;
  ProKey local_198;
  QString local_168;
  ProKey local_148;
  ProString local_118;
  QString local_e8;
  QString local_d0;
  QString local_b8;
  QArrayData *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString> local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->vcProject).Configuration.windeployqt.ExcludedFromBuild = true;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  QVar7.m_data = (storage_type *)0xb;
  QVar7.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar7);
  pDVar3 = local_78.a.a.d.d;
  config.m_data = local_78.a.a.d.ptr;
  config.m_size = local_78.a.a.d.size;
  bVar6 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
  if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
    }
  }
  if (bVar6) {
    pQVar2 = &((this->vcProject).Configuration.windeployqt.Record.d.d)->super_QArrayData;
    (this->vcProject).Configuration.windeployqt.Record.d.d = (Data *)0x0;
    (this->vcProject).Configuration.windeployqt.Record.d.ptr =
         L"$(TargetName).windeployqt.$(Platform).$(Configuration)";
    (this->vcProject).Configuration.windeployqt.Record.d.size = 0x36;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_148,"QMAKE_WINDEPLOYQT");
    QMakeEvaluator::first(&local_118,&pQVar1->super_QMakeEvaluator,&local_148);
    ProString::toQString(&local_e8,&local_118);
    QDir::toNativeSeparators((QString *)&local_d0);
    MakefileGenerator::shellQuote(&local_b8,(MakefileGenerator *)this,&local_d0);
    qVar5 = local_b8.d.size;
    pcVar4 = local_b8.d.ptr;
    pDVar3 = local_b8.d.d;
    local_b8.d.size = 0;
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = (char16_t *)0x0;
    ProKey::ProKey(&local_198,"WINDEPLOYQT_OPTIONS");
    this_00 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&local_198);
    ProStringList::join(&local_168,this_00,(QChar)0x20);
    local_78.b.d.size = local_168.d.size;
    local_78.b.d.ptr = local_168.d.ptr;
    local_78.b.d.d = local_168.d.d;
    local_78.a.a.d.d = pDVar3;
    local_78.a.a.d.ptr = pcVar4;
    local_78.a.a.d.size = qVar5;
    local_78.a.b.ch = ' ';
    local_168.d.d = (Data *)0x0;
    local_168.d.ptr = (char16_t *)0x0;
    local_168.d.size = 0;
    QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString>::convertTo<QString>
              ((QString *)&local_98,&local_78);
    QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString>::~QStringBuilder(&local_78);
    if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_198.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_198.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_198.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_148.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_148.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    MakefileGenerator::shellQuote
              (&local_118.m_string,(MakefileGenerator *)this,
               &(this->vcProject).Configuration.windeployqt.Record);
    local_78.b.d.size = local_118.m_string.d.size;
    local_78.b.d.ptr = local_118.m_string.d.ptr;
    local_78.b.d.d = local_118.m_string.d.d;
    local_78.a.a.d.ptr = (storage_type_conflict *)0x0;
    local_78.a.a.d.size = 0x2b41c2;
    local_78.a.b.ch = 'R';
    local_78.a._25_7_ = 0;
    local_118.m_string.d.d = (Data *)0x0;
    local_118.m_string.d.ptr = (char16_t *)0x0;
    local_118.m_string.d.size = 0;
    local_78.a.a.d.d = (Data *)&local_98;
    ::operator+=(&(this->vcProject).Configuration.windeployqt.CommandLine,
                 (QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString> *)&local_78);
    QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString> *)&local_78);
    if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    (this->vcProject).Configuration.windeployqt.config = &(this->vcProject).Configuration;
    (this->vcProject).Configuration.windeployqt.ExcludedFromBuild = false;
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initWinDeployQtTool()
{
    VCConfiguration &conf = vcProject.Configuration;
    conf.windeployqt.ExcludedFromBuild = true;
    if (project->isActiveConfig("windeployqt")) {
        conf.windeployqt.Record = QStringLiteral("$(TargetName).windeployqt.$(Platform).$(Configuration)");
        const QString commandLine = MakefileGenerator::shellQuote(QDir::toNativeSeparators(project->first("QMAKE_WINDEPLOYQT").toQString()))
                + QLatin1Char(' ') + project->values("WINDEPLOYQT_OPTIONS").join(QLatin1Char(' '));

        //  Visual Studio copies all files to be deployed into the MSIL directory
        //  and then invokes MDILXapCompile on it, which checks for managed code and
        //  translates it into native code. The problem is that all entries of the
        //  package will be copied into the MSIL directly, losing the subdirectory
        //  structure (for instance for plugins). However, the MDILXapCompile call
        //  itself contains the original subdirectories as parameters and hence the
        //  call fails.
        //  Hence the only way to get a build done is to recreate the directory
        //  structure manually by invoking windeployqt a second time, so that
        //  the MDILXapCompile call succeeds and deployment continues.
        conf.windeployqt.CommandLine += commandLine
                + QStringLiteral(" -list relative -dir \"$(MSBuildProjectDirectory)\" \"$(OutDir)\\$(TargetFileName)\" > ")
                + MakefileGenerator::shellQuote(conf.windeployqt.Record);
        conf.windeployqt.config = &vcProject.Configuration;
        conf.windeployqt.ExcludedFromBuild = false;
    }
}